

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O1

void __thiscall QMimeAllGlobPatterns::removeMimeType(QMimeAllGlobPatterns *this,QString *mimeType)

{
  ulong uVar1;
  Data<QHashPrivate::Node<QString,_QList<QString>_>_> *pDVar2;
  PatternsMap *__range1;
  ulong uVar3;
  Data *pDVar4;
  long in_FS_OFFSET;
  anon_class_16_1_94f2130c_for__M_pred local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->m_fastPatterns).d;
  if (pDVar2 == (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    if (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::detached(pDVar2);
      (this->m_fastPatterns).d = pDVar2;
    }
    pDVar4 = (this->m_fastPatterns).d;
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (pDVar4->numBuckets == uVar3) goto LAB_004b504f;
        uVar1 = uVar3 + 1;
      } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_004b5052;
    }
  }
  uVar3 = 0;
LAB_004b5052:
  do {
    if (uVar3 == 0 && pDVar4 == (Data *)0x0) {
      local_38.mimeType.m_data = (mimeType->d).ptr;
      local_38.mimeType.m_size = (mimeType->d).size;
      QtPrivate::
      sequential_erase_if<QList<QMimeGlobPattern>,QMimeGlobPatternList::removeMimeType(QStringView)::_lambda(QMimeGlobPattern_const&)_1_>
                (&(this->m_highWeightGlobs).super_QList<QMimeGlobPattern>,&local_38);
      local_38.mimeType.m_data = (mimeType->d).ptr;
      local_38.mimeType.m_size = (mimeType->d).size;
      QtPrivate::
      sequential_erase_if<QList<QMimeGlobPattern>,QMimeGlobPatternList::removeMimeType(QStringView)::_lambda(QMimeGlobPattern_const&)_1_>
                (&(this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>,&local_38);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
        __stack_chk_fail();
      }
      return;
    }
    QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
              ((QList<QString> *)
               (((pDVar4->spans[uVar3 >> 7].entries)->storage).data +
               (ulong)((uint)pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] * 0x30) + 0x18),
               mimeType);
    do {
      if (pDVar4->numBuckets - 1 == uVar3) goto LAB_004b504f;
      uVar3 = uVar3 + 1;
    } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while( true );
LAB_004b504f:
  uVar3 = 0;
  pDVar4 = (Data *)0x0;
  goto LAB_004b5052;
}

Assistant:

void QMimeAllGlobPatterns::removeMimeType(const QString &mimeType)
{
    for (auto &x : m_fastPatterns)
        x.removeAll(mimeType);
    m_highWeightGlobs.removeMimeType(mimeType);
    m_lowWeightGlobs.removeMimeType(mimeType);
}